

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void u_entered_shop(char *enterstring)

{
  short sVar1;
  int iVar2;
  boolean bVar3;
  char cVar4;
  int iVar5;
  monst *mtmp;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  obj *poVar9;
  bool bVar10;
  obj *local_48;
  obj *mattock;
  obj *pick;
  char *tool;
  int cnt;
  boolean should_block;
  eshk *eshkp;
  monst *shkp;
  int rt;
  char *enterstring_local;
  
  if (*enterstring != '\0') {
    nomul(0,(char *)0x0);
    mtmp = shop_keeper(level,*enterstring);
    if (mtmp == (monst *)0x0) {
      pcVar6 = strchr(u_entered_shop::empty_shops,(int)*enterstring);
      if (pcVar6 == (char *)0x0) {
        pcVar6 = in_rooms(level,u.ux,u.uy,0x12);
        pcVar7 = in_rooms(level,u.ux0,u.uy0,0x12);
        if (pcVar6 != pcVar7) {
          pline("This shop appears to be deserted.");
        }
      }
      strcpy(u_entered_shop::empty_shops,u.ushops);
      u.ushops[0] = '\0';
    }
    else {
      iVar5 = inhishop(mtmp);
      if (iVar5 == 0) {
        mtmp[0x1b].mnum = -1000;
        mtmp[0x1b].m_lev = 0xff;
        mtmp[0x1b].mx = -1;
        mtmp[0x1b].my = -1;
        mtmp[0x1b].mux = -1;
        mtmp[0x1b].muy = -1;
        mtmp[0x1b].malign = -1;
        pcVar6 = strchr(u_entered_shop::empty_shops,(int)*enterstring);
        if (pcVar6 == (char *)0x0) {
          pline("This shop appears to be deserted.");
        }
        strcpy(u_entered_shop::empty_shops,u.ushops);
        u.ushops[0] = '\0';
      }
      else {
        *(undefined1 **)&mtmp[0x1b].mnum = &mtmp->field_0x74;
        sVar1._0_1_ = mtmp[0x1b].mnamelth;
        sVar1._1_1_ = mtmp[0x1b].mxtyp;
        if (((sVar1 == 0) || (mtmp[0x1b].field_0x75 != '\0')) &&
           (iVar5 = strncasecmp(&mtmp[0x1b].field_0x75,plname,0x20), iVar5 != 0)) {
          mtmp[0x1b].mnamelth = '\0';
          mtmp[0x1b].mxtyp = '\0';
          *(undefined1 *)((long)&mtmp[0x1b].meating + 1) = 0;
          strncpy(&mtmp[0x1b].field_0x75,plname,0x20);
          pacify_shk(mtmp);
        }
        if ((((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) &&
            ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) &&
           (*(char *)((long)&mtmp[0x1b].meating + 1) == '\0')) {
          if ((((u.uprops[0xd].intrinsic != 0) || (u.uprops[0xd].extrinsic != 0)) ||
              ((youmonst.data == mons + 0x9e || (youmonst.data == mons + 0x7b)))) &&
             (u.uprops[0xd].blocked == 0)) {
            pcVar6 = shkname(mtmp);
            pline("%s senses your presence.",pcVar6);
            bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
            if (bVar3 == '\0') {
              verbalize("Invisible customers are not welcome!");
              return;
            }
          }
          if ((((uarmu != (obj *)0x0) && (uarmu->otyp == 0x7a)) && (uarm == (obj *)0x0)) &&
             (uarmc == (obj *)0x0)) {
            bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
            mtmp[0x1b].field_0x74 = (bVar3 != '\0' ^ 0xffU) & 1;
          }
          bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level);
          if (((bVar3 == '\0') || (u.umonnum < 1)) || (mons[u.umonnum].mlet == '5')) {
            iVar5 = (int)level->rooms[*enterstring + -3].rtype;
            if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) == 0) {
              pcVar6 = shkname(mtmp);
              pcVar6 = s_suffix(pcVar6);
              verbalize("So, %s, you dare return to %s %s?!",plname,pcVar6,
                        shtypes[iVar5 + -0x12].name);
            }
            else {
              iVar2._0_1_ = mtmp[0x1b].mtame;
              iVar2._1_1_ = mtmp[0x1b].m_ap_type;
              iVar2._2_1_ = mtmp[0x1b].mfrozen;
              iVar2._3_1_ = mtmp[0x1b].mblinded;
              if (iVar2 == 0) {
                if ((mtmp[0x1b].field_0x74 == '\0') ||
                   (cVar4 = inside_shop(level,u.ux,u.uy), cVar4 != '\0')) {
                  pcVar6 = Hello(mtmp);
                  sVar1 = *(short *)&mtmp[0x1b].mnamelth;
                  *(short *)&mtmp[0x1b].mnamelth = sVar1 + 1;
                  pcVar7 = "";
                  if (sVar1 != 0) {
                    pcVar7 = " again";
                  }
                  pcVar8 = shkname(mtmp);
                  pcVar8 = s_suffix(pcVar8);
                  verbalize("%s, %s!  Welcome%s to %s %s!",pcVar6,plname,pcVar7,pcVar8,
                            shtypes[iVar5 + -0x12].name);
                }
              }
              else {
                pcVar6 = shkname(mtmp);
                pline("%s mutters imprecations against shoplifters.",pcVar6);
              }
            }
            cVar4 = inside_shop(level,u.ux,u.uy);
            if ((cVar4 == '\0') &&
               (bVar3 = on_level(&u.uz,&dungeon_topology.d_blackmarket_level), bVar3 == '\0')) {
              mattock = carrying(0x108);
              local_48 = carrying(0x33);
              if ((mattock == (obj *)0x0) && (local_48 == (obj *)0x0)) {
                if (u.usteed == (monst *)0x0) {
                  if (mtmp[0x1b].field_0x74 == '\0') {
                    if ((u.uprops[0x1a].intrinsic != 0) ||
                       (bVar10 = false, u.uprops[0x1a].extrinsic != 0)) {
                      poVar9 = sobj_at(0x108,level,(int)u.ux,(int)u.uy);
                      bVar10 = true;
                      if (poVar9 == (obj *)0x0) {
                        poVar9 = sobj_at(0x33,level,(int)u.ux,(int)u.uy);
                        bVar10 = poVar9 != (obj *)0x0;
                      }
                    }
                  }
                  else {
                    verbalize("I don\'t sell to your kind here.");
                    bVar10 = true;
                  }
                }
                else {
                  pcVar6 = "Leave %s outside.";
                  if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
                    pcVar6 = "Will you please leave %s outside?";
                  }
                  pcVar7 = y_monnam(u.usteed);
                  verbalize(pcVar6,pcVar7);
                  bVar10 = true;
                }
              }
              else {
                tool._0_4_ = 1;
                if ((mattock == (obj *)0x0) || (local_48 == (obj *)0x0)) {
                  if (mattock == (obj *)0x0) {
                    pick = (obj *)0x377eee;
                    while (local_48 = local_48->nobj, local_48 != (obj *)0x0) {
                      if (local_48->otyp == 0x33) {
                        tool._0_4_ = (int)tool + 1;
                      }
                    }
                    if (((u.uprops[0x1e].intrinsic == 0) &&
                        (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
                         (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
                       ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
                      discover_object(0x33,'\x01','\x01');
                    }
                  }
                  else {
                    pick = (obj *)anon_var_dwarf_739fb;
                    while (mattock = mattock->nobj, mattock != (obj *)0x0) {
                      if (mattock->otyp == 0x108) {
                        tool._0_4_ = (int)tool + 1;
                      }
                    }
                  }
                }
                else {
                  pick = (obj *)0x37fd0f;
                  tool._0_4_ = 2;
                }
                pcVar6 = "Leave the %s%s outside.";
                if ((*(uint *)&mtmp->field_0x60 >> 0x16 & 1) != 0) {
                  pcVar6 = "Will you please leave your %s%s outside?";
                }
                pcVar7 = "s";
                if ((int)tool == 1) {
                  pcVar7 = "";
                }
                verbalize(pcVar6,pick,pcVar7);
                bVar10 = true;
              }
              if (bVar10) {
                dochug(mtmp);
              }
            }
          }
          else {
            verbalize("Non-human customers are not welcome!");
          }
        }
      }
    }
  }
  return;
}

Assistant:

void u_entered_shop(char *enterstring)
{

	int rt;
	struct monst *shkp;
	struct eshk *eshkp;
	static const char no_shk[] = "This shop appears to be deserted.";
	static char empty_shops[5];

	if (!*enterstring)
	    return;

	/* interrupt multi-turn stuff */
	nomul(0, NULL);

	if (!(shkp = shop_keeper(level, *enterstring))) {
	    if (!strchr(empty_shops, *enterstring) &&
		in_rooms(level, u.ux, u.uy, SHOPBASE) !=
				  in_rooms(level, u.ux0, u.uy0, SHOPBASE))
		pline(no_shk);
	    strcpy(empty_shops, u.ushops);
	    u.ushops[0] = '\0';
	    return;
	}

	eshkp = ESHK(shkp);

	if (!inhishop(shkp)) {
	    /* dump core when referenced */
	    eshkp->bill_p = (struct bill_x *) -1000;
	    if (!strchr(empty_shops, *enterstring))
		pline(no_shk);
	    strcpy(empty_shops, u.ushops);
	    u.ushops[0] = '\0';
	    return;
	}

	eshkp->bill_p = &(eshkp->bill[0]);

	if ((!eshkp->visitct || *eshkp->customer) &&
	    strncmpi(eshkp->customer, plname, PL_NSIZ)) {
	    /* You seem to be new here */
	    eshkp->visitct = 0;
	    eshkp->following = 0;
	    strncpy(eshkp->customer,plname,PL_NSIZ);
	    pacify_shk(shkp);
	}

	if (shkp->msleeping || !shkp->mcanmove || eshkp->following)
	    return;	/* no dialog */

	if (Invis) {
	    pline("%s senses your presence.", shkname(shkp));
	    if (!Is_blackmarket(&u.uz)) {
		verbalize("Invisible customers are not welcome!");
		return;
	    }
	}

	/* visible striped prison shirt (but black marketeer won't mind) */
	if (uarmu && uarmu->otyp == STRIPED_SHIRT && !uarm && !uarmc)
	    eshkp->pbanned = !Is_blackmarket(&u.uz);

	if (Is_blackmarket(&u.uz) &&
		u.umonnum > 0 && mons[u.umonnum].mlet != S_HUMAN) {
	    verbalize("Non-human customers are not welcome!");
	    return;
	}

	rt = level->rooms[*enterstring - ROOMOFFSET].rtype;

	if (ANGRY(shkp)) {
	    verbalize("So, %s, you dare return to %s %s?!",
		      plname,
		      s_suffix(shkname(shkp)),
		      shtypes[rt - SHOPBASE].name);
	} else if (eshkp->robbed) {
	    pline("%s mutters imprecations against shoplifters.", shkname(shkp));
	} else if (!eshkp->pbanned || inside_shop(level, u.ux, u.uy)) {
	    verbalize("%s, %s!  Welcome%s to %s %s!",
		      Hello(shkp), plname,
		      eshkp->visitct++ ? " again" : "",
		      s_suffix(shkname(shkp)),
		      shtypes[rt - SHOPBASE].name);
	}
	/* can't do anything about blocking if teleported in */
	if (!inside_shop(level, u.ux, u.uy) && !Is_blackmarket(&u.uz)) {
	    boolean should_block;
	    int cnt;
	    const char *tool;
	    struct obj *pick = carrying(PICK_AXE),
		       *mattock = carrying(DWARVISH_MATTOCK);

	    if (pick || mattock) {
		cnt = 1;	/* so far */
		if (pick && mattock) {	/* carrying both types */
		    tool = "digging tool";
		    cnt = 2;	/* `more than 1' is all that matters */
		} else if (pick) {
		    tool = "pick-axe";
		    /* hack: `pick' already points somewhere into inventory */
		    while ((pick = pick->nobj) != 0)
			if (pick->otyp == PICK_AXE) ++cnt;
		} else {	/* assert(mattock != 0) */
		    tool = "mattock";
		    while ((mattock = mattock->nobj) != 0)
			if (mattock->otyp == DWARVISH_MATTOCK) ++cnt;
		    /* [ALI] Shopkeeper identifies mattock(s) */
		    if (!Blind) makeknown(DWARVISH_MATTOCK);
		}
		verbalize(NOTANGRY(shkp) ?
			  "Will you please leave your %s%s outside?" :
			  "Leave the %s%s outside.",
			  tool, plur(cnt));
		should_block = TRUE;
	    } else if (u.usteed) {
		verbalize(NOTANGRY(shkp) ?
			  "Will you please leave %s outside?" :
			  "Leave %s outside.", y_monnam(u.usteed));
		should_block = TRUE;
	    } else if (eshkp->pbanned) {
		verbalize("I don't sell to your kind here.");
		should_block = TRUE;
	    } else {
		should_block = (Fast && (sobj_at(PICK_AXE, level, u.ux, u.uy) ||
				      sobj_at(DWARVISH_MATTOCK, level, u.ux, u.uy)));
	    }
	    if (should_block) dochug(shkp);  /* shk gets extra move */
	}
	return;
}